

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O0

double birthday_cdf(int n)

{
  undefined4 local_24;
  double dStack_20;
  int i;
  double cdf;
  double dStack_10;
  int n_local;
  
  if (n < 1) {
    dStack_10 = 0.0;
  }
  else if (n < 0x16e) {
    dStack_20 = 1.0;
    for (local_24 = 1; local_24 <= n; local_24 = local_24 + 1) {
      dStack_20 = (dStack_20 * (double)(0x16e - local_24)) / 365.0;
    }
    dStack_10 = 1.0 - dStack_20;
  }
  else {
    dStack_10 = 1.0;
  }
  return dStack_10;
}

Assistant:

double birthday_cdf ( int n )

//****************************************************************************80
//
//  Purpose:
//
//    BIRTHDAY_CDF returns the Birthday Concurrence CDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    26 August 2006
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int N, the number of people whose birthdays have been
//    disclosed.
//
//    Output, double BIRTHDAY_CDF, the probability that at least
//    two of the N people have matching birthays..
//
{
  double cdf;
  int i;

  if ( n < 1 )
  {
    cdf = 0.0;
    return cdf;
  }
  else if ( 365 < n )
  {
    cdf = 1.0;
    return cdf;
  }
//
//  Compute the probability that N people have distinct birthdays.
//
  cdf = 1.0;
  for ( i = 1; i <= n; i++ )
  {
    cdf = cdf * static_cast<double>(365 + 1 - i ) / 365.0;
  }
//
//  Compute the probability that it is NOT the case that N people
//  have distinct birthdays.  This is the cumulative probability
//  that person 2 matches person 1, or person 3 matches 1 or 2,
//  etc.
//
  cdf = 1.0 - cdf;

  return cdf;
}